

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O0

void __thiscall Assimp::ASEImporter::ConvertMaterial(ASEImporter *this,Material *mat)

{
  ai_real *paVar1;
  aiMaterial *this_00;
  long lVar2;
  undefined1 local_838 [8];
  aiString tex;
  uint iWire;
  aiShadingMode eShading;
  int i;
  aiString name;
  Material *mat_local;
  ASEImporter *this_local;
  
  this_00 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(this_00);
  mat->pcInstance = this_00;
  (mat->super_Material).mAmbient.r =
       (this->mParser->m_clrAmbient).r + (mat->super_Material).mAmbient.r;
  (mat->super_Material).mAmbient.g =
       (this->mParser->m_clrAmbient).g + (mat->super_Material).mAmbient.g;
  (mat->super_Material).mAmbient.b =
       (this->mParser->m_clrAmbient).b + (mat->super_Material).mAmbient.b;
  aiString::aiString((aiString *)&eShading);
  aiString::Set((aiString *)&eShading,&(mat->super_Material).mName);
  aiMaterial::AddProperty(mat->pcInstance,(aiString *)&eShading,"?mat.name",0,0);
  aiMaterial::AddProperty(mat->pcInstance,&(mat->super_Material).mAmbient,1,"$clr.ambient",0,0);
  aiMaterial::AddProperty(mat->pcInstance,&(mat->super_Material).mDiffuse,1,"$clr.diffuse",0,0);
  aiMaterial::AddProperty(mat->pcInstance,&(mat->super_Material).mSpecular,1,"$clr.specular",0,0);
  aiMaterial::AddProperty(mat->pcInstance,&(mat->super_Material).mEmissive,1,"$clr.emissive",0,0);
  paVar1 = &(mat->super_Material).mSpecularExponent;
  if (((*paVar1 == 0.0) && (!NAN(*paVar1))) ||
     ((paVar1 = &(mat->super_Material).mShininessStrength, *paVar1 == 0.0 && (!NAN(*paVar1))))) {
    if ((((mat->super_Material).mShading == Metal) || ((mat->super_Material).mShading == Phong)) ||
       ((mat->super_Material).mShading == Blinn)) {
      (mat->super_Material).mShading = Gouraud;
    }
  }
  else {
    aiMaterial::AddProperty
              (mat->pcInstance,&(mat->super_Material).mSpecularExponent,1,"$mat.shininess",0,0);
    aiMaterial::AddProperty
              (mat->pcInstance,&(mat->super_Material).mShininessStrength,1,"$mat.shinpercent",0,0);
  }
  aiMaterial::AddProperty<float>
            (mat->pcInstance,&(mat->super_Material).mTransparency,1,"$mat.opacity",0,0);
  if (((mat->super_Material).mTwoSided & 1U) != 0) {
    iWire = 1;
    aiMaterial::AddProperty<int>(mat->pcInstance,(int *)&iWire,1,"$mat.twosided",0,0);
  }
  tex.data[0x3fc] = '\t';
  tex.data[0x3fd] = '\0';
  tex.data[0x3fe] = '\0';
  tex.data[0x3ff] = '\0';
  switch((mat->super_Material).mShading) {
  case Wire:
    tex.data[0x3f8] = '\x01';
    tex.data[0x3f9] = '\0';
    tex.data[0x3fa] = '\0';
    tex.data[0x3fb] = '\0';
    aiMaterial::AddProperty<int>(mat->pcInstance,(int *)(tex.data + 0x3f8),1,"$mat.wireframe",0,0);
  case Gouraud:
    tex.data[0x3fc] = '\x02';
    tex.data[0x3fd] = '\0';
    tex.data[0x3fe] = '\0';
    tex.data[0x3ff] = '\0';
    break;
  case Flat:
    tex.data[0x3fc] = '\x01';
    tex.data[0x3fd] = '\0';
    tex.data[0x3fe] = '\0';
    tex.data[0x3ff] = '\0';
    break;
  case Phong:
    tex.data[0x3fc] = '\x03';
    tex.data[0x3fd] = '\0';
    tex.data[0x3fe] = '\0';
    tex.data[0x3ff] = '\0';
    break;
  case Metal:
    tex.data[0x3fc] = '\b';
    tex.data[0x3fd] = '\0';
    tex.data[0x3fe] = '\0';
    tex.data[0x3ff] = '\0';
    break;
  case Blinn:
    tex.data[0x3fc] = '\x04';
    tex.data[0x3fd] = '\0';
    tex.data[0x3fe] = '\0';
    tex.data[0x3ff] = '\0';
  }
  aiMaterial::AddProperty<int>(mat->pcInstance,(int *)(tex.data + 0x3fc),1,"$mat.shadingm",0,0);
  lVar2 = std::__cxx11::string::length();
  if (lVar2 != 0) {
    CopyASETexture(mat->pcInstance,&(mat->super_Material).sTexDiffuse,aiTextureType_DIFFUSE);
  }
  lVar2 = std::__cxx11::string::length();
  if (lVar2 != 0) {
    CopyASETexture(mat->pcInstance,&(mat->super_Material).sTexSpecular,aiTextureType_SPECULAR);
  }
  lVar2 = std::__cxx11::string::length();
  if (lVar2 != 0) {
    CopyASETexture(mat->pcInstance,&(mat->super_Material).sTexAmbient,aiTextureType_AMBIENT);
  }
  lVar2 = std::__cxx11::string::length();
  if (lVar2 != 0) {
    CopyASETexture(mat->pcInstance,&(mat->super_Material).sTexOpacity,aiTextureType_OPACITY);
  }
  lVar2 = std::__cxx11::string::length();
  if (lVar2 != 0) {
    CopyASETexture(mat->pcInstance,&(mat->super_Material).sTexEmissive,aiTextureType_EMISSIVE);
  }
  lVar2 = std::__cxx11::string::length();
  if (lVar2 != 0) {
    CopyASETexture(mat->pcInstance,&(mat->super_Material).sTexBump,aiTextureType_HEIGHT);
  }
  lVar2 = std::__cxx11::string::length();
  if (lVar2 != 0) {
    CopyASETexture(mat->pcInstance,&(mat->super_Material).sTexShininess,aiTextureType_SHININESS);
  }
  lVar2 = std::__cxx11::string::length();
  if (lVar2 != 0) {
    aiString::aiString((aiString *)local_838);
    aiString::Set((aiString *)local_838,&(mat->super_Material).mName);
    aiMaterial::AddProperty(mat->pcInstance,(aiString *)local_838,"?mat.name",0,0);
  }
  return;
}

Assistant:

void ASEImporter::ConvertMaterial(ASE::Material& mat)
{
    // LARGE TODO: Much code her is copied from 3DS ... join them maybe?

    // Allocate the output material
    mat.pcInstance = new aiMaterial();

    // At first add the base ambient color of the
    // scene to the material
    mat.mAmbient.r += mParser->m_clrAmbient.r;
    mat.mAmbient.g += mParser->m_clrAmbient.g;
    mat.mAmbient.b += mParser->m_clrAmbient.b;

    aiString name;
    name.Set( mat.mName);
    mat.pcInstance->AddProperty( &name, AI_MATKEY_NAME);

    // material colors
    mat.pcInstance->AddProperty( &mat.mAmbient, 1, AI_MATKEY_COLOR_AMBIENT);
    mat.pcInstance->AddProperty( &mat.mDiffuse, 1, AI_MATKEY_COLOR_DIFFUSE);
    mat.pcInstance->AddProperty( &mat.mSpecular, 1, AI_MATKEY_COLOR_SPECULAR);
    mat.pcInstance->AddProperty( &mat.mEmissive, 1, AI_MATKEY_COLOR_EMISSIVE);

    // shininess
    if (0.0f != mat.mSpecularExponent && 0.0f != mat.mShininessStrength)
    {
        mat.pcInstance->AddProperty( &mat.mSpecularExponent, 1, AI_MATKEY_SHININESS);
        mat.pcInstance->AddProperty( &mat.mShininessStrength, 1, AI_MATKEY_SHININESS_STRENGTH);
    }
    // If there is no shininess, we can disable phong lighting
    else if (D3DS::Discreet3DS::Metal == mat.mShading ||
        D3DS::Discreet3DS::Phong == mat.mShading ||
        D3DS::Discreet3DS::Blinn == mat.mShading)
    {
        mat.mShading = D3DS::Discreet3DS::Gouraud;
    }

    // opacity
    mat.pcInstance->AddProperty<ai_real>( &mat.mTransparency,1,AI_MATKEY_OPACITY);

    // Two sided rendering?
    if (mat.mTwoSided)
    {
        int i = 1;
        mat.pcInstance->AddProperty<int>(&i,1,AI_MATKEY_TWOSIDED);
    }

    // shading mode
    aiShadingMode eShading = aiShadingMode_NoShading;
    switch (mat.mShading)
    {
        case D3DS::Discreet3DS::Flat:
            eShading = aiShadingMode_Flat; break;
        case D3DS::Discreet3DS::Phong :
            eShading = aiShadingMode_Phong; break;
        case D3DS::Discreet3DS::Blinn :
            eShading = aiShadingMode_Blinn; break;

            // I don't know what "Wire" shading should be,
            // assume it is simple lambertian diffuse (L dot N) shading
        case D3DS::Discreet3DS::Wire:
            {
                // set the wireframe flag
                unsigned int iWire = 1;
                mat.pcInstance->AddProperty<int>( (int*)&iWire,1,AI_MATKEY_ENABLE_WIREFRAME);
            }
        case D3DS::Discreet3DS::Gouraud:
            eShading = aiShadingMode_Gouraud; break;
        case D3DS::Discreet3DS::Metal :
            eShading = aiShadingMode_CookTorrance; break;
    }
    mat.pcInstance->AddProperty<int>( (int*)&eShading,1,AI_MATKEY_SHADING_MODEL);

    // DIFFUSE texture
    if( mat.sTexDiffuse.mMapName.length() > 0)
        CopyASETexture(*mat.pcInstance,mat.sTexDiffuse, aiTextureType_DIFFUSE);

    // SPECULAR texture
    if( mat.sTexSpecular.mMapName.length() > 0)
        CopyASETexture(*mat.pcInstance,mat.sTexSpecular, aiTextureType_SPECULAR);

    // AMBIENT texture
    if( mat.sTexAmbient.mMapName.length() > 0)
        CopyASETexture(*mat.pcInstance,mat.sTexAmbient, aiTextureType_AMBIENT);

    // OPACITY texture
    if( mat.sTexOpacity.mMapName.length() > 0)
        CopyASETexture(*mat.pcInstance,mat.sTexOpacity, aiTextureType_OPACITY);

    // EMISSIVE texture
    if( mat.sTexEmissive.mMapName.length() > 0)
        CopyASETexture(*mat.pcInstance,mat.sTexEmissive, aiTextureType_EMISSIVE);

    // BUMP texture
    if( mat.sTexBump.mMapName.length() > 0)
        CopyASETexture(*mat.pcInstance,mat.sTexBump, aiTextureType_HEIGHT);

    // SHININESS texture
    if( mat.sTexShininess.mMapName.length() > 0)
        CopyASETexture(*mat.pcInstance,mat.sTexShininess, aiTextureType_SHININESS);

    // store the name of the material itself, too
    if( mat.mName.length() > 0) {
        aiString tex;tex.Set( mat.mName);
        mat.pcInstance->AddProperty( &tex, AI_MATKEY_NAME);
    }
    return;
}